

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseProcessorInstance(StructuralParser *this,Graph *graph)

{
  bool bVar1;
  ProcessorInstance *newInstance;
  UnqualifiedName *pUVar2;
  QualifiedIdentifier *pQVar3;
  Expression *pEVar4;
  long lStack_60;
  _Alloc_hider local_50;
  
  getContext((Context *)&stack0xffffffffffffffb0,this);
  newInstance = allocate<soul::AST::ProcessorInstance,soul::AST::Context>
                          (this,(Context *)&stack0xffffffffffffffb0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&stack0xffffffffffffffb0);
  pUVar2 = parseUnqualifiedName(this);
  (newInstance->instanceName).object = pUVar2;
  AST::Graph::addProcessorInstance(graph,newInstance);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a3521);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x2a3337);
  if (!bVar1) {
    Errors::expectedProcessorName<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&stack0xffffffffffffffb0);
    CompileMessage::~CompileMessage((CompileMessage *)&stack0xffffffffffffffb0);
  }
  pQVar3 = parseQualifiedIdentifier(this);
  (newInstance->targetProcessor).object = &pQVar3->super_Expression;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2cada8);
  if (bVar1) {
    pEVar4 = parseExpression(this,false);
    (newInstance->arraySize).object = pEVar4;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a0190);
  }
  parseSpecialisationArgs((StructuralParser *)&stack0xffffffffffffffb0);
  (newInstance->specialisationArgs).object = (Expression *)local_50._M_p;
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c9772);
  if (bVar1) {
    lStack_60 = 0x40;
  }
  else {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2995);
    if (!bVar1) {
      return;
    }
    lStack_60 = 0x48;
  }
  pEVar4 = parseExpression(this,false);
  *(Expression **)((long)&(newInstance->super_ASTObject)._vptr_ASTObject + lStack_60) = pEVar4;
  return;
}

Assistant:

void parseProcessorInstance (AST::Graph& graph)
    {
        auto& u = allocate<AST::ProcessorInstance> (getContext());
        u.instanceName = parseUnqualifiedName();
        graph.addProcessorInstance (u);

        expect (Operator::assign);

        if (! matches (Token::identifier))
            throwError (Errors::expectedProcessorName());

        u.targetProcessor = parseQualifiedIdentifier();

        // Array of processors
        if (matchIf (Operator::openBracket))
        {
            u.arraySize = parseExpression();
            expect (Operator::closeBracket);
        }

        // Parameterised
        u.specialisationArgs = parseSpecialisationArgs();

        // Clocked
        if (matchIf (Operator::times))
            u.clockMultiplierRatio = parseExpression();
        else if (matchIf (Operator::divide))
            u.clockDividerRatio = parseExpression();
    }